

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QSqlDriverCreatorBase_*>_>::freeData
          (Span<QHashPrivate::Node<QString,_QSqlDriverCreatorBase_*>_> *this)

{
  byte *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  byte *local_18;
  
  if (*(long *)(in_RDI + 0x80) != 0) {
    for (local_18 = in_RDI; local_18 != in_RDI + 0x80; local_18 = local_18 + 1) {
      if (*local_18 != 0xff) {
        Entry::node((Entry *)(*(long *)(in_RDI + 0x80) + (ulong)*local_18 * 0x20));
        Node<QString,_QSqlDriverCreatorBase_*>::~Node
                  ((Node<QString,_QSqlDriverCreatorBase_*> *)0x125fa1);
      }
    }
    if (*(void **)(in_RDI + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x80));
    }
    in_RDI[0x80] = 0;
    in_RDI[0x81] = 0;
    in_RDI[0x82] = 0;
    in_RDI[0x83] = 0;
    in_RDI[0x84] = 0;
    in_RDI[0x85] = 0;
    in_RDI[0x86] = 0;
    in_RDI[0x87] = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }